

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::WindowStateChangedEvent,QWindow*,QFlags<Qt::WindowState>,QFlags<Qt::WindowState>>
               (QWindow *args,QFlags<Qt::WindowState> args_1,QFlags<Qt::WindowState> args_2)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  undefined4 in_EDX;
  undefined4 in_ESI;
  WindowStateChangedEvent *in_RDI;
  long in_FS_OFFSET;
  WindowStateChangedEvent event;
  undefined4 in_stack_ffffffffffffff98;
  ProcessEventsFlag in_stack_ffffffffffffff9c;
  QFlagsStorage<Qt::WindowState> in_stack_ffffffffffffffa8;
  QFlagsStorage<Qt::WindowState> in_stack_ffffffffffffffac;
  QFlagsStorage<Qt::WindowState> in_stack_ffffffffffffffb8;
  QFlagsStorage<Qt::WindowState> in_stack_ffffffffffffffbc;
  undefined1 local_40 [16];
  byte local_30;
  undefined4 local_10;
  undefined4 local_c;
  long lVar4;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_EDX;
  local_c = in_ESI;
  uVar3 = QThread::isMainThread();
  if ((uVar3 & 1) == 0) {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::WindowStateChangedEvent,QWindow*,QFlags<Qt::WindowState>,QFlags<Qt::WindowState>>
              ((QWindow *)CONCAT44(in_stack_ffffffffffffffac.i,in_stack_ffffffffffffffa8.i),
               (QFlags<Qt::WindowState>)in_stack_ffffffffffffffbc.i,
               (QFlags<Qt::WindowState>)in_stack_ffffffffffffffb8.i);
    QFlags<QEventLoop::ProcessEventsFlag>::QFlags
              ((QFlags<QEventLoop::ProcessEventsFlag> *)in_RDI,in_stack_ffffffffffffff9c);
    bVar1 = QWindowSystemInterface::flushWindowSystemEvents
                      ((QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>)
                       SUB84((ulong)lVar4 >> 0x20,0));
    goto LAB_00449458;
  }
  memset(local_40,0xaa,0x30);
  QWindowSystemInterfacePrivate::WindowStateChangedEvent::WindowStateChangedEvent
            (in_RDI,(QWindow *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (WindowStates)in_stack_ffffffffffffffac.i,(WindowStates)in_stack_ffffffffffffffa8.i);
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent
              ((WindowSystemEvent *)CONCAT44(local_c,local_10));
LAB_004493fd:
    bVar1 = local_30 & 1;
  }
  else {
    uVar2 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,local_40);
    if ((uVar2 & 1) != 0) goto LAB_004493fd;
    bVar1 = 0;
  }
  QWindowSystemInterfacePrivate::WindowStateChangedEvent::~WindowStateChangedEvent(in_RDI);
LAB_00449458:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}